

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O2

void __thiscall QStringMatcher::QStringMatcher(QStringMatcher *this,QStringMatcher *other)

{
  this->d_ptr = (QStringMatcherPrivate *)0x0;
  this->q_cs = CaseSensitive;
  memset(&this->q_pattern,0,0x128);
  operator=(this,other);
  return;
}

Assistant:

QStringMatcher::QStringMatcher(const QStringMatcher &other)
    : d_ptr(nullptr)
{
    operator=(other);
}